

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::Compressed2DFormatCase::iterate(Compressed2DFormatCase *this)

{
  code *pcVar1;
  RenderContext *context;
  bool bVar2;
  int iVar3;
  int preferredWidth;
  int preferredHeight;
  deUint32 dVar4;
  RGBA threshold_00;
  undefined4 extraout_var;
  TestLog *log_00;
  undefined4 extraout_var_00;
  Texture2D *pTVar6;
  char *pcVar7;
  undefined4 extraout_var_01;
  PixelFormat *pPVar8;
  TextureFormat *pTVar9;
  reference pvVar10;
  undefined4 extraout_var_02;
  Texture2DView TVar11;
  undefined1 local_228 [7];
  bool isOk;
  ConstPixelBufferAccess *local_220;
  SurfaceAccess local_218;
  PixelBufferAccess local_1f8;
  Vector<float,_2> local_1cc;
  Vector<float,_2> local_1c4;
  Vector<float,_4> local_1bc;
  Sampler local_1ac;
  TextureFormat local_170;
  undefined1 local_164 [8];
  TextureFormatInfo spec;
  ReferenceParams renderParams;
  vector<float,_std::allocator<float>_> texCoord;
  RGBA threshold;
  undefined1 local_60 [8];
  Surface referenceFrame;
  Surface renderedFrame;
  RandomViewport viewport;
  TestLog *log;
  Functions *gl;
  Compressed2DFormatCase *this_local;
  long lVar5;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pTVar6 = glu::Texture2D::getRefTexture(this->m_texture);
  preferredWidth = tcu::Texture2D::getWidth(pTVar6);
  pTVar6 = glu::Texture2D::getRefTexture(this->m_texture);
  preferredHeight = tcu::Texture2D::getHeight(pTVar6);
  pcVar7 = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(pcVar7);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&renderedFrame.m_pixels.m_cap,
             (RenderTarget *)CONCAT44(extraout_var_00,iVar3),preferredWidth,preferredHeight,dVar4);
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,viewport.x,viewport.y);
  tcu::Surface::Surface((Surface *)local_60,viewport.x,viewport.y);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar8 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar3));
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = tcu::PixelFormat::getColorThreshold(pPVar8);
  tcu::RGBA::RGBA((RGBA *)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,1,1,1,1);
  threshold_00 = tcu::operator+((RGBA *)((long)&texCoord.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4),
                                (RGBA *)&texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)(spec.lookupBias.m_data + 2),TEXTURETYPE_2D);
  pTVar6 = glu::Texture2D::getRefTexture(this->m_texture);
  pTVar9 = tcu::TextureLevelPyramid::getFormat(&pTVar6->super_TextureLevelPyramid);
  tcu::getTextureFormatInfo((TextureFormatInfo *)local_164,pTVar9);
  pTVar6 = glu::Texture2D::getRefTexture(this->m_texture);
  pTVar9 = tcu::TextureLevelPyramid::getFormat(&pTVar6->super_TextureLevelPyramid);
  local_170 = *pTVar9;
  spec.lookupBias.m_data[3] = (float)glu::TextureTestUtil::getSamplerType(local_170);
  tcu::Vector<float,_4>::Vector(&local_1bc,0.0,0.0,0.0,0.0);
  tcu::Sampler::Sampler
            (&local_1ac,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,NEAREST,NEAREST,0.0,true,
             COMPAREMODE_NONE,0,&local_1bc,false,MODE_DEPTH);
  tcu::Sampler::operator=
            ((Sampler *)(renderParams.super_RenderParams.colorBias.m_data + 2),&local_1ac);
  renderParams.super_RenderParams.bias = spec.valueMax.m_data[2];
  renderParams.super_RenderParams.ref = spec.valueMax.m_data[3];
  renderParams.super_RenderParams.colorScale.m_data[0] = spec.lookupScale.m_data[0];
  renderParams.super_RenderParams.colorScale.m_data[1] = spec.lookupScale.m_data[1];
  renderParams.super_RenderParams.colorScale.m_data[2] = spec.lookupScale.m_data[2];
  renderParams.super_RenderParams.colorScale.m_data[3] = spec.lookupScale.m_data[3];
  renderParams.super_RenderParams.colorBias.m_data[0] = spec.lookupBias.m_data[0];
  renderParams.super_RenderParams.colorBias.m_data[1] = spec.lookupBias.m_data[1];
  tcu::Vector<float,_2>::Vector(&local_1c4,0.0,0.0);
  tcu::Vector<float,_2>::Vector(&local_1cc,1.0,1.0);
  glu::TextureTestUtil::computeQuadTexCoord2D
            ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel,&local_1c4,&local_1cc)
  ;
  (**(code **)(lVar5 + 0x1a00))
            ((int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,viewport.x,
             viewport.y);
  (**(code **)(lVar5 + 8))(0x84c0);
  pcVar1 = *(code **)(lVar5 + 0xb8);
  dVar4 = glu::Texture2D::getGLTexture(this->m_texture);
  (*pcVar1)(0xde1,dVar4);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,0x2600);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFormatTests.cpp"
                  ,0x345);
  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel,0);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,pvVar10,(RenderParams *)(spec.lookupBias.m_data + 2));
  context = this->m_renderCtx;
  tcu::Surface::getAccess(&local_1f8,(Surface *)&referenceFrame.m_pixels.m_cap);
  glu::readPixels(context,(int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,
                  &local_1f8);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar8 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_02,iVar3));
  tcu::SurfaceAccess::SurfaceAccess(&local_218,(Surface *)local_60,pPVar8);
  pTVar6 = glu::Texture2D::getRefTexture(this->m_texture);
  TVar11 = tcu::Texture2D::operator_cast_to_Texture2DView(pTVar6);
  local_220 = TVar11.m_levels;
  local_228._0_4_ = TVar11.m_numLevels;
  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel,0);
  glu::TextureTestUtil::sampleTexture
            (&local_218,(Texture2DView *)local_228,pvVar10,
             (ReferenceParams *)(spec.lookupBias.m_data + 2));
  bVar2 = glu::TextureTestUtil::compareImages
                    (log_00,(Surface *)local_60,(Surface *)&referenceFrame.m_pixels.m_cap,
                     threshold_00);
  pcVar7 = "Image comparison failed";
  if (bVar2) {
    pcVar7 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(byte)~bVar2 & QP_TEST_RESULT_FAIL,
             pcVar7);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel);
  tcu::Surface::~Surface((Surface *)local_60);
  tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
  return STOP;
}

Assistant:

Compressed2DFormatCase::IterateResult Compressed2DFormatCase::iterate (void)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), m_texture->getRefTexture().getWidth(), m_texture->getRefTexture().getHeight(), deStringHash(getName()));
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);
	tcu::Surface			referenceFrame		(viewport.width, viewport.height);
	tcu::RGBA				threshold			= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>			texCoord;
	ReferenceParams			renderParams		(TEXTURETYPE_2D);
	tcu::TextureFormatInfo	spec				= tcu::getTextureFormatInfo(m_texture->getRefTexture().getFormat());

	renderParams.samplerType	= getSamplerType(m_texture->getRefTexture().getFormat());
	renderParams.sampler		= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	renderParams.colorScale		= spec.lookupScale;
	renderParams.colorBias		= spec.lookupBias;

	computeQuadTexCoord2D(texCoord, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Draw.
	m_renderer.renderQuad(0, &texCoord[0], renderParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compute reference.
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], renderParams);

	// Compare and log.
	bool isOk = compareImages(log, referenceFrame, renderedFrame, threshold);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");

	return STOP;
}